

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80.c
# Opt level: O1

void g80_prep(disisa *isa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int v;
  int v_00;
  int v_01;
  vardata *data;
  
  data = vardata_new("g80isa");
  isa->vardata = data;
  iVar1 = vardata_add_feature(data,"sm11","SM1.1 new opcodes");
  iVar2 = vardata_add_feature(isa->vardata,"sm12","SM1.2 new opcodes");
  iVar3 = vardata_add_feature(isa->vardata,"fp64","64-bit floating point");
  iVar4 = vardata_add_feature(isa->vardata,"d3d10_1","Direct3D 10.1 new features");
  if ((((iVar1 != -1) && (iVar2 != -1)) && (iVar3 != -1)) && (iVar4 != -1)) {
    vardata_feature_imply(isa->vardata,iVar2,iVar1);
    iVar5 = vardata_add_varset(isa->vardata,"chipset","GPU chipset");
    if (iVar5 != -1) {
      iVar6 = vardata_add_variant(isa->vardata,"g80","G80",iVar5);
      v = vardata_add_variant(isa->vardata,"g84","G84:G200",iVar5);
      v_00 = vardata_add_variant(isa->vardata,"g200","G200",iVar5);
      v_01 = vardata_add_variant(isa->vardata,"mcp77","MCP77, MCP79",iVar5);
      iVar5 = vardata_add_variant(isa->vardata,"gt215","GT215+",iVar5);
      if (((iVar6 != -1) && (v != -1)) && ((v_00 != -1 && ((v_01 != -1 && (iVar5 != -1)))))) {
        vardata_variant_feature(isa->vardata,v,iVar1);
        vardata_variant_feature(isa->vardata,v_00,iVar2);
        vardata_variant_feature(isa->vardata,v_01,iVar2);
        vardata_variant_feature(isa->vardata,iVar5,iVar2);
        vardata_variant_feature(isa->vardata,v_00,iVar3);
        vardata_variant_feature(isa->vardata,iVar5,iVar4);
        iVar1 = vardata_add_modeset(isa->vardata,"ptype","Program type");
        if (iVar1 != -1) {
          iVar2 = vardata_add_mode(isa->vardata,"vp","vertex program",iVar1);
          iVar3 = vardata_add_mode(isa->vardata,"gp","geometry program",iVar1);
          iVar4 = vardata_add_mode(isa->vardata,"fp","fragment program",iVar1);
          iVar1 = vardata_add_mode(isa->vardata,"cp","compute program",iVar1);
          if ((((iVar2 != -1) && (iVar3 != -1)) && (iVar4 != -1)) && (iVar1 != -1)) {
            iVar1 = vardata_validate(isa->vardata);
            if (iVar1 == 0) {
              return;
            }
          }
        }
      }
    }
  }
  abort();
}

Assistant:

static void g80_prep(struct disisa *isa) {
	isa->vardata = vardata_new("g80isa");
	int f_sm11 = vardata_add_feature(isa->vardata, "sm11", "SM1.1 new opcodes");
	int f_sm12 = vardata_add_feature(isa->vardata, "sm12", "SM1.2 new opcodes");
	int f_fp64 = vardata_add_feature(isa->vardata, "fp64", "64-bit floating point");
	int f_d3d10_1 = vardata_add_feature(isa->vardata, "d3d10_1", "Direct3D 10.1 new features");
	if (f_sm11 == -1 || f_sm12 == -1 || f_fp64 == -1 || f_d3d10_1 == -1)
		abort();
	vardata_feature_imply(isa->vardata, f_sm12, f_sm11);
	int vs_chipset = vardata_add_varset(isa->vardata, "chipset", "GPU chipset");
	if (vs_chipset == -1)
		abort();
	int v_g80 = vardata_add_variant(isa->vardata, "g80", "G80", vs_chipset);
	int v_g84 = vardata_add_variant(isa->vardata, "g84", "G84:G200", vs_chipset);
	int v_g200 = vardata_add_variant(isa->vardata, "g200", "G200", vs_chipset);
	int v_mcp77 = vardata_add_variant(isa->vardata, "mcp77", "MCP77, MCP79", vs_chipset);
	int v_gt215 = vardata_add_variant(isa->vardata, "gt215", "GT215+", vs_chipset);
	if (v_g80 == -1 || v_g84 == -1 || v_g200 == -1 || v_mcp77 == -1 || v_gt215 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_g84, f_sm11);
	vardata_variant_feature(isa->vardata, v_g200, f_sm12);
	vardata_variant_feature(isa->vardata, v_mcp77, f_sm12);
	vardata_variant_feature(isa->vardata, v_gt215, f_sm12);
	vardata_variant_feature(isa->vardata, v_g200, f_fp64);
	vardata_variant_feature(isa->vardata, v_gt215, f_d3d10_1);
	int ms_ptype = vardata_add_modeset(isa->vardata, "ptype", "Program type");
	if (ms_ptype == -1)
		abort();
	int m_vp = vardata_add_mode(isa->vardata, "vp", "vertex program", ms_ptype);
	int m_gp = vardata_add_mode(isa->vardata, "gp", "geometry program", ms_ptype);
	int m_fp = vardata_add_mode(isa->vardata, "fp", "fragment program", ms_ptype);
	int m_cp = vardata_add_mode(isa->vardata, "cp", "compute program", ms_ptype);
	if (m_vp == -1 || m_gp == -1 || m_fp == -1 || m_cp == -1)
		abort();
	if (vardata_validate(isa->vardata))
		abort();
}